

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O0

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::SetSideEffects
          (ScriptContextOptimizationOverrideInfo *this,SideEffects se)

{
  SideEffects se_local;
  ScriptContextOptimizationOverrideInfo *this_local;
  
  if (this->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
    this->sideEffects = this->sideEffects | se;
  }
  else if ((this->sideEffects & se) != se) {
    ForEachCrossSiteInfo<Js::ScriptContextOptimizationOverrideInfo::SetSideEffects(Js::SideEffects)::__0>
              (this,(anon_class_1_1_3fcf6710)se);
  }
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::SetSideEffects(SideEffects se)
{
    if (this->crossSiteRoot == nullptr)
    {
        sideEffects = (SideEffects)(sideEffects | se);
    }
    else if ((sideEffects & se) != se)
    {
        ForEachCrossSiteInfo([se](ScriptContextOptimizationOverrideInfo * info)
        {
            Assert((info->sideEffects & se) != se);
            info->sideEffects = (SideEffects)(info->sideEffects | se);
        });
    }
}